

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_to_imp.c
# Opt level: O0

int indexForIMP(IMP anIMP,trampoline_set **setptr)

{
  ptrdiff_t offset;
  trampoline_set *set;
  trampoline_set **setptr_local;
  IMP anIMP_local;
  
  offset = (ptrdiff_t)*setptr;
  while( true ) {
    if (offset == 0) {
      return -1;
    }
    if (((IMP)(*(long *)offset + 0x1000U) <= anIMP) && (anIMP < (IMP)(*(long *)offset + 0x2000U)))
    break;
    offset = *(ptrdiff_t *)(offset + 8);
  }
  *setptr = (trampoline_set *)offset;
  return (int)((ulong)((long)anIMP - (*(long *)offset + 0x1000)) >> 4);
}

Assistant:

static int indexForIMP(IMP anIMP, struct trampoline_set **setptr)
{
	for (struct trampoline_set *set=*setptr ; set!=NULL ; set=set->next)
	{
		if (((char*)anIMP >= set->buffers->rx_buffer) &&
		    ((char*)anIMP < &set->buffers->rx_buffer[PAGE_SIZE]))
		{
			*setptr = set;
			ptrdiff_t offset = (char*)anIMP - set->buffers->rx_buffer;
			return offset / sizeof(struct block_header);
		}
	}
	return -1;
}